

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup.c
# Opt level: O2

pair_lookup_t *
pair_lookup_create(pair_lookup_t *__return_storage_ptr__,uint rate,uint order,uint *table)

{
  byte bVar1;
  distance_pair_key_t *pdVar2;
  output_pair_t *poVar3;
  void *__ptr;
  ulong uVar4;
  distance_pair_t *pdVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  size_t __nmemb;
  
  __nmemb = 1;
  uVar8 = 1 << ((char)order - 1U & 0x1f);
  pdVar2 = (distance_pair_key_t *)malloc((long)(int)uVar8 << 2);
  __return_storage_ptr__->keys = pdVar2;
  bVar1 = (byte)rate;
  uVar4 = (ulong)(uint)(1 << (bVar1 * '\x02' & 0x1f));
  poVar3 = (output_pair_t *)calloc(uVar4,4);
  __return_storage_ptr__->outputs = poVar3;
  __ptr = calloc(uVar4,4);
  uVar4 = 0;
  while( true ) {
    iVar9 = (int)__nmemb;
    if ((ulong)uVar8 * 2 == uVar4) break;
    uVar7 = table[(int)uVar4 + 1] << (bVar1 & 0x1f) | table[uVar4 & 0xffffffff];
    iVar6 = *(int *)((long)__ptr + (ulong)uVar7 * 4);
    if (iVar6 == 0) {
      *(int *)((long)__ptr + (ulong)uVar7 * 4) = iVar9;
      poVar3[__nmemb] = uVar7;
      __nmemb = (size_t)(iVar9 + 1);
      iVar6 = iVar9;
    }
    *(int *)((long)pdVar2 + uVar4 * 2) = iVar6;
    uVar4 = uVar4 + 2;
  }
  __return_storage_ptr__->outputs_len = __nmemb;
  __return_storage_ptr__->output_mask = ~(-1 << (bVar1 & 0x1f));
  __return_storage_ptr__->output_width = rate;
  pdVar5 = (distance_pair_t *)calloc(__nmemb,4);
  __return_storage_ptr__->distances = pdVar5;
  free(__ptr);
  return __return_storage_ptr__;
}

Assistant:

pair_lookup_t pair_lookup_create(unsigned int rate,
                                 unsigned int order,
                                 const unsigned int *table) {
    pair_lookup_t pairs;

    pairs.keys = malloc(sizeof(unsigned int) * (1 << (order - 1)));
    pairs.outputs = calloc((1 << (rate * 2)), sizeof(unsigned int));
    unsigned int *inv_outputs = calloc((1 << (rate * 2)), sizeof(unsigned int));
    unsigned int output_counter = 1;
    // for every (even-numbered) shift register state, find the concatenated output of the state
    //   and the subsequent state that follows it (low bit set). then, check to see if this
    //   concatenated output has a unique key assigned to it already. if not, give it a key.
    //   if it does, retrieve the key. assign this key to the shift register state.
    for (unsigned int i = 0; i < (1 << (order - 1)); i++) {
        // first get the concatenated pair of outputs
        unsigned int out = table[i * 2 + 1];
        out <<= rate;
        out |= table[i * 2];

        // does this concatenated output exist in the outputs table yet?
        if (!inv_outputs[out]) {
            // doesn't exist, allocate a new key
            inv_outputs[out] = output_counter;
            pairs.outputs[output_counter] = out;
            output_counter++;
        }
        // set the opaque key for the ith shift register state to the concatenated output entry
        pairs.keys[i] = inv_outputs[out];
    }
    pairs.outputs_len = output_counter;
    pairs.output_mask = (1 << (rate)) - 1;
    pairs.output_width = rate;
    pairs.distances = calloc(pairs.outputs_len, sizeof(distance_pair_t));
    free(inv_outputs);
    return pairs;
}